

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall
capnp::_::StructBuilder::transferContentFrom(StructBuilder *this,StructBuilder other)

{
  bool bVar1;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> end;
  uint uVar2;
  unsigned_short *puVar3;
  byte *ptr;
  Iterator local_50;
  Iterator local_4e;
  Range<unsigned_short> RStack_4c;
  unsigned_short i_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  Range<unsigned_short> *__range2_1;
  Iterator local_38;
  Iterator local_36;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_short_&>_> sharedPointerCount;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  byte *local_20;
  byte *unshared;
  StructBuilder *pSStack_10;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int_&>_> sharedDataSize;
  StructBuilder *this_local;
  
  pSStack_10 = this;
  unshared._4_4_ = kj::min<unsigned_int&,unsigned_int&>(&this->dataSize,&other.dataSize);
  if (unshared._4_4_ < this->dataSize) {
    if (this->dataSize == 1) {
      setDataField<bool>(this,0,false);
    }
    else {
      ptr = (byte *)((long)this->data + (ulong)(unshared._4_4_ >> 3));
      local_20 = ptr;
      uVar2 = subtractChecked<unsigned_int,unsigned_int,capnp::_::StructBuilder::transferContentFrom(capnp::_::StructBuilder)::__0>
                        (this->dataSize,unshared._4_4_,
                         (anon_class_1_0_00000001 *)((long)&__range2 + 7));
      WireHelpers::zeroMemory(ptr,uVar2 >> 3);
    }
  }
  if (unshared._4_4_ == 1) {
    bVar1 = getDataField<bool>(&other,0);
    setDataField<bool>(this,0,bVar1);
  }
  else {
    WireHelpers::copyMemory((byte *)this->data,(byte *)other.data,unshared._4_4_ >> 3);
  }
  _sharedPointerCount = kj::zeroTo<unsigned_short>(this->pointerCount);
  ___end2 = (Range<unsigned_short> *)&sharedPointerCount;
  local_36 = kj::Range<unsigned_short>::begin(___end2);
  local_38 = kj::Range<unsigned_short>::end(___end2);
  while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_36,&local_38), bVar1) {
    puVar3 = kj::Range<unsigned_short>::Iterator::operator*(&local_36);
    WireHelpers::zeroObject(this->segment,this->capTable,this->pointers + (int)(uint)*puVar3);
    kj::Range<unsigned_short>::Iterator::operator++(&local_36);
  }
  WireHelpers::zeroMemory(this->pointers,(uint)this->pointerCount);
  end = kj::min<unsigned_short&,unsigned_short&>(&this->pointerCount,&other.pointerCount);
  RStack_4c = kj::zeroTo<unsigned_short>(end);
  ___end2_1 = &stack0xffffffffffffffb4;
  local_4e = kj::Range<unsigned_short>::begin(___end2_1);
  local_50 = kj::Range<unsigned_short>::end(___end2_1);
  while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_4e,&local_50), bVar1) {
    puVar3 = kj::Range<unsigned_short>::Iterator::operator*(&local_4e);
    WireHelpers::transferPointer
              (this->segment,this->pointers + (int)(uint)*puVar3,other.segment,
               other.pointers + (int)(uint)*puVar3);
    kj::Range<unsigned_short>::Iterator::operator++(&local_4e);
  }
  WireHelpers::zeroMemory(other.pointers,(uint)end);
  return;
}

Assistant:

void StructBuilder::transferContentFrom(StructBuilder other) {
  // Determine the amount of data the builders have in common.
  auto sharedDataSize = kj::min(dataSize, other.dataSize);

  if (dataSize > sharedDataSize) {
    // Since the target is larger than the source, make sure to zero out the extra bits that the
    // source doesn't have.
    if (dataSize == ONE * BITS) {
      setDataField<bool>(ZERO * ELEMENTS, false);
    } else {
      byte* unshared = reinterpret_cast<byte*>(data) + sharedDataSize / BITS_PER_BYTE;
      // Note: this subtraction can't fail due to the if() above
      WireHelpers::zeroMemory(unshared,
          subtractChecked(dataSize, sharedDataSize, []() {}) / BITS_PER_BYTE);
    }
  }

  // Copy over the shared part.
  if (sharedDataSize == ONE * BITS) {
    setDataField<bool>(ZERO * ELEMENTS, other.getDataField<bool>(ZERO * ELEMENTS));
  } else {
    WireHelpers::copyMemory(reinterpret_cast<byte*>(data),
                            reinterpret_cast<byte*>(other.data),
                            sharedDataSize / BITS_PER_BYTE);
  }

  // Zero out all pointers in the target.
  for (auto i: kj::zeroTo(pointerCount)) {
    WireHelpers::zeroObject(segment, capTable, pointers + i);
  }
  WireHelpers::zeroMemory(pointers, pointerCount);

  // Transfer the pointers.
  auto sharedPointerCount = kj::min(pointerCount, other.pointerCount);
  for (auto i: kj::zeroTo(sharedPointerCount)) {
    WireHelpers::transferPointer(segment, pointers + i, other.segment, other.pointers + i);
  }

  // Zero out the pointers that were transferred in the source because it no longer has ownership.
  // If the source had any extra pointers that the destination didn't have space for, we
  // intentionally leave them be, so that they'll be cleaned up later.
  WireHelpers::zeroMemory(other.pointers, sharedPointerCount);
}